

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_9(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  ostream *this_00;
  QPDFWriter local_148 [8];
  QPDFWriter w;
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  QPDFObjectHandle local_e8;
  QPDFObjectHandle local_d8;
  allocator<char> local_c1;
  string local_c0 [40];
  logic_error *e;
  undefined1 local_88 [8];
  QPDFObjectHandle rstream;
  undefined1 local_68 [8];
  QPDFObjectHandle qstream;
  uchar *bp;
  undefined1 local_38 [8];
  shared_ptr<Buffer> buf;
  QPDFObjectHandle root;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDF::getRoot();
  std::make_shared<Buffer,unsigned_int>((uint *)local_38);
  std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_38);
  qstream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Buffer::getBuffer();
  (qstream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x726f662061746164;
  *(undefined8 *)
   &(qstream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count = 0x7274732077656e20;
  *(undefined4 *)
   &qstream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._vptr__Sp_counted_base = 0xa6d6165;
  this = &rstream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  std::shared_ptr<Buffer>::shared_ptr((shared_ptr<Buffer> *)this,(shared_ptr<Buffer> *)local_38);
  QPDFObjectHandle::newStream(local_68,pdf,this);
  std::shared_ptr<Buffer>::~shared_ptr
            ((shared_ptr<Buffer> *)
             &rstream.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::newStream((QPDF *)local_88);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&e);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&e);
  this_00 = std::operator<<((ostream *)&std::cout,"oops -- getStreamData didn\'t throw");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"data for other stream\n",&local_c1);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData
            ((string *)local_88,(QPDFObjectHandle *)local_c0,(QPDFObjectHandle *)&local_d8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"/QStream",&local_109);
  QPDFObjectHandle::replaceKey
            ((string *)&buf.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDFObjectHandle *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"/RStream",&local_131);
  QPDFObjectHandle::replaceKey
            ((string *)&buf.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDFObjectHandle *)local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  QPDFWriter::QPDFWriter(local_148,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_148,0));
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_148);
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_148);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_88);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_38);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &buf.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_9(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle root = pdf.getRoot();
    // Explicitly exercise the Buffer version of newStream
    auto buf = std::make_shared<Buffer>(20U);
    unsigned char* bp = buf->getBuffer();
    memcpy(bp, "data for new stream\n", 20); // no null!
    QPDFObjectHandle qstream = QPDFObjectHandle::newStream(&pdf, buf);
    QPDFObjectHandle rstream = QPDFObjectHandle::newStream(&pdf);
    try {
        rstream.getStreamData();
        std::cout << "oops -- getStreamData didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "exception: " << e.what() << std::endl;
    }
    rstream.replaceStreamData(
        "data for other stream\n", QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    root.replaceKey("/QStream", qstream);
    root.replaceKey("/RStream", rstream);
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}